

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_rcbuf.c
# Opt level: O2

int nghttp2_rcbuf_new(nghttp2_rcbuf **rcbuf_ptr,size_t size,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_rcbuf *pnVar2;
  
  pnVar2 = (nghttp2_rcbuf *)nghttp2_mem_malloc(mem,size + 0x28);
  if (pnVar2 == (nghttp2_rcbuf *)0x0) {
    iVar1 = -0x385;
  }
  else {
    *rcbuf_ptr = pnVar2;
    pnVar2->mem_user_data = mem->mem_user_data;
    (*rcbuf_ptr)->free = mem->free;
    (*rcbuf_ptr)->base = (uint8_t *)(pnVar2 + 1);
    pnVar2 = *rcbuf_ptr;
    pnVar2->len = size;
    pnVar2->ref = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_rcbuf_new(nghttp2_rcbuf **rcbuf_ptr, size_t size,
                      nghttp2_mem *mem) {
  uint8_t *p;

  p = nghttp2_mem_malloc(mem, sizeof(nghttp2_rcbuf) + size);
  if (p == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  *rcbuf_ptr = (void *)p;

  (*rcbuf_ptr)->mem_user_data = mem->mem_user_data;
  (*rcbuf_ptr)->free = mem->free;
  (*rcbuf_ptr)->base = p + sizeof(nghttp2_rcbuf);
  (*rcbuf_ptr)->len = size;
  (*rcbuf_ptr)->ref = 1;

  return 0;
}